

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loader.c
# Opt level: O1

Library * CreateLibrary(char *file)

{
  Library *pLVar1;
  uint64_t uVar2;
  
  pLVar1 = (Library *)malloc(0x20);
  if (pLVar1 == (Library *)0x0) {
    pLVar1 = (Library *)0x0;
  }
  else {
    pLVar1->file = file;
    uVar2 = NFusage_worker(file,0);
    pLVar1->size = uVar2;
    pLVar1->address = (Raw)0x0;
    pLVar1->internal = (Raw)0x0;
  }
  return pLVar1;
}

Assistant:

Library *CreateLibrary(const char *file)
{
    Library *lib = malloc(sizeof(Library));
    if (!lib)
    {
        return NULL;
    }
    lib->file = file;
    lib->size = NFusage_worker(file, 0);
    lib->address = NULL;
    lib->internal = NULL;
    return lib;
}